

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::HasFieldValuePair
          (CrateReader *this,FieldValuePairVector *fvs,string *name,string *tyname)

{
  pointer ppVar1;
  __type _Var2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
  *fv;
  pointer __lhs;
  string local_50;
  
  ppVar1 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__lhs = (fvs->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __lhs != ppVar1; __lhs = __lhs + 1) {
    _Var2 = ::std::operator==(&__lhs->first,name);
    if (_Var2) {
      linb::any::type_name_abi_cxx11_(&local_50,(any *)&__lhs->second);
      _Var2 = ::std::operator==(&local_50,tyname);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) break;
    }
  }
  return __lhs != ppVar1;
}

Assistant:

bool CrateReader::HasFieldValuePair(const FieldValuePairVector &fvs,
                                    const std::string &name,
                                    const std::string &tyname) {
  for (const auto &fv : fvs) {
    if ((fv.first == name) && (fv.second.type_name() == tyname)) {
      return true;
    }
  }

  return false;
}